

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-types.cc
# Opt level: O1

float tinyusdz::value::half_to_float(half h)

{
  uint uVar1;
  float fVar2;
  
  uVar1 = (uint)h.value << 0xd;
  if ((h.value & 0x7c00) == 0x7c00) {
    fVar2 = (float)(uVar1 | 0x70000000);
  }
  else if ((h.value & 0x7c00) == 0) {
    fVar2 = (float)(uVar1 | 0x38800000) + -6.1035156e-05;
  }
  else {
    fVar2 = (float)((uVar1 & 0xfffe000) + 0x38000000);
  }
  return (float)((int)(short)h.value & 0x80000000U | (uint)fVar2);
}

Assistant:

float half_to_float_le(float16le h) {
  static const FP32le magic = {113 << 23};
  static const unsigned int shifted_exp = 0x7c00
                                          << 13;  // exponent mask after shift
  FP32le o;

  o.u = (h.u & 0x7fffU) << 13U;           // exponent/mantissa bits
  unsigned int exp_ = shifted_exp & o.u;  // just the exponent
  o.u += (127 - 15) << 23;                // exponent adjust

  // handle exponent special cases
  if (exp_ == shifted_exp)    // Inf/NaN?
    o.u += (128 - 16) << 23;  // extra exp adjust
  else if (exp_ == 0)         // Zero/Denormal?
  {
    o.u += 1 << 23;  // extra exp adjust
    o.f -= magic.f;  // renormalize
  }

  o.u |= (h.u & 0x8000U) << 16U;  // sign bit
  return o.f;
}